

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-utils.h
# Opt level: O1

int __thiscall wasm::UnneededSetRemover::remove(UnneededSetRemover *this,char *__filename)

{
  Expression *expression;
  bool bVar1;
  uintptr_t extraout_RAX;
  uintptr_t extraout_RAX_00;
  uintptr_t uVar2;
  Drop *output;
  EffectAnalyzer local_190;
  
  expression = *(Expression **)(__filename + 0x18);
  bVar1 = LocalSet::isTee((LocalSet *)__filename);
  if (bVar1) {
    Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>::replaceCurrent
              ((Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_> *)
               this,expression);
    uVar2 = (expression->type).id;
    if (uVar2 != *(uintptr_t *)(__filename + 8)) {
      this->refinalize = true;
    }
  }
  else {
    EffectAnalyzer::EffectAnalyzer
              (&local_190,this->passOptions,this->module,*(Expression **)(__filename + 0x18));
    bVar1 = true;
    if (local_190.trap == false) {
      bVar1 = EffectAnalyzer::hasNonTrapSideEffects(&local_190);
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_190.delegateTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_190.breakTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_190.globalsWritten._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&local_190.mutableGlobalsRead._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_190.localsWritten._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_190.localsRead._M_t);
    if (bVar1 == false) {
      *__filename = '\x16';
      __filename[8] = '\0';
      __filename[9] = '\0';
      __filename[10] = '\0';
      __filename[0xb] = '\0';
      __filename[0xc] = '\0';
      __filename[0xd] = '\0';
      __filename[0xe] = '\0';
      __filename[0xf] = '\0';
      uVar2 = extraout_RAX;
    }
    else {
      *__filename = '\x12';
      __filename[8] = '\0';
      __filename[9] = '\0';
      __filename[10] = '\0';
      __filename[0xb] = '\0';
      __filename[0xc] = '\0';
      __filename[0xd] = '\0';
      __filename[0xe] = '\0';
      __filename[0xf] = '\0';
      *(Expression **)(__filename + 0x10) = expression;
      Drop::finalize((Drop *)__filename);
      uVar2 = extraout_RAX_00;
    }
  }
  this->removed = true;
  return (int)uVar2;
}

Assistant:

void remove(LocalSet* set) {
    auto* value = set->value;
    if (set->isTee()) {
      replaceCurrent(value);
      if (value->type != set->type) {
        // The value is more refined, so we'll need to refinalize.
        refinalize = true;
      }
    } else if (EffectAnalyzer(passOptions, module, set->value)
                 .hasSideEffects()) {
      Drop* drop = ExpressionManipulator::convert<LocalSet, Drop>(set);
      drop->value = value;
      drop->finalize();
    } else {
      ExpressionManipulator::nop(set);
    }
    removed = true;
  }